

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O2

StatisticsType duckdb::BaseStatistics::GetStatsType(LogicalType *type)

{
  PhysicalType PVar1;
  StatisticsType SVar2;
  
  SVar2 = BASE_STATS;
  if (type->id_ != SQLNULL) {
    PVar1 = type->physical_type_;
    SVar2 = NUMERIC_STATS;
    switch(PVar1) {
    case BOOL:
    case UINT8:
    case INT8:
    case UINT16:
    case INT16:
    case UINT32:
    case INT32:
    case UINT64:
    case INT64:
    case FLOAT:
    case DOUBLE:
      break;
    case UINT64|UINT8:
    case DOUBLE|BOOL:
    case DOUBLE|UINT8:
    case DOUBLE|INT8:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case INTERVAL:
    case 0x16:
    case STRUCT|BOOL:
    case STRUCT|UINT8:
    case STRUCT|INT8:
    case STRUCT|UINT16:
      return BASE_STATS;
    case LIST:
      return LIST_STATS;
    case STRUCT:
      return STRUCT_STATS;
    case ARRAY:
      return ARRAY_STATS;
    default:
      if (1 < PVar1 - 0xcb) {
        if (PVar1 != VARCHAR) {
          return BASE_STATS;
        }
        return STRING_STATS;
      }
    }
  }
  return SVar2;
}

Assistant:

StatisticsType BaseStatistics::GetStatsType(const LogicalType &type) {
	if (type.id() == LogicalTypeId::SQLNULL) {
		return StatisticsType::BASE_STATS;
	}
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::UINT8:
	case PhysicalType::UINT16:
	case PhysicalType::UINT32:
	case PhysicalType::UINT64:
	case PhysicalType::INT128:
	case PhysicalType::UINT128:
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
		return StatisticsType::NUMERIC_STATS;
	case PhysicalType::VARCHAR:
		return StatisticsType::STRING_STATS;
	case PhysicalType::STRUCT:
		return StatisticsType::STRUCT_STATS;
	case PhysicalType::LIST:
		return StatisticsType::LIST_STATS;
	case PhysicalType::ARRAY:
		return StatisticsType::ARRAY_STATS;
	case PhysicalType::BIT:
	case PhysicalType::INTERVAL:
	default:
		return StatisticsType::BASE_STATS;
	}
}